

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_proxy_getPrototypeOf(JSContext *ctx,JSValue obj)

{
  int iVar1;
  uint uVar2;
  JSRefCountHeader *p;
  JSProxyData *argv;
  JSValueUnion JVar3;
  JSValueUnion JVar4;
  int64_t iVar5;
  uint uVar6;
  JSRefCountHeader *p_1;
  JSValue v;
  JSValue JVar7;
  JSValue JVar8;
  JSValue method;
  JSValueUnion local_38;
  int64_t local_30;
  
  argv = get_proxy_method(ctx,(JSValue *)&local_38,obj,0x5f);
  if (argv == (JSProxyData *)0x0) goto LAB_0011c016;
  if ((int)local_30 == 3) {
    JVar7 = JS_GetPrototype(ctx,argv->target);
    return JVar7;
  }
  JVar7.tag = local_30;
  JVar7.u.float64 = local_38.float64;
  JVar7 = JS_CallFree(ctx,JVar7,argv->handler,1,&argv->target);
  JVar3 = JVar7.u;
  uVar6 = (uint)JVar7.tag;
  if (uVar6 == 6) {
    return JVar7;
  }
  if ((uVar6 != 2) && (uVar6 != 0xffffffff)) goto LAB_0011c06e;
  JVar4.ptr = (argv->target).u.ptr;
  iVar5 = (argv->target).tag;
  if ((int)iVar5 == -1) {
    if (*(short *)((long)JVar4.ptr + 6) != 0x29) {
      uVar2 = *(byte *)((long)JVar4.ptr + 5) & 1;
LAB_0011bfd5:
      if (uVar2 != 0) {
        return JVar7;
      }
      JVar4.ptr = (argv->target).u.ptr;
      iVar5 = (argv->target).tag;
      goto LAB_0011bfe6;
    }
    uVar2 = js_proxy_isExtensible(ctx,argv->target);
    if (-1 < (int)uVar2) goto LAB_0011bfd5;
  }
  else {
LAB_0011bfe6:
    JVar8.tag = iVar5;
    JVar8.u.ptr = JVar4.ptr;
    JVar8 = JS_GetPrototype(ctx,JVar8);
    v.tag = JVar8.tag;
    JVar4 = JVar8.u;
    uVar2 = (uint)JVar8.tag;
    if (uVar2 != 6) {
      if (JVar4.ptr == JVar3.ptr) {
        if (uVar2 < 0xfffffff5) {
          return JVar7;
        }
        iVar1 = *JVar4.ptr;
        *(int *)JVar4.ptr = iVar1 + -1;
        if (1 < iVar1) {
          return JVar7;
        }
        v.u.ptr = JVar3.ptr;
        __JS_FreeValueRT(ctx->rt,v);
        return JVar7;
      }
      if ((0xfffffff4 < uVar2) && (iVar1 = *JVar4.ptr, *(int *)JVar4.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar8);
      }
LAB_0011c06e:
      if ((0xfffffff4 < uVar6) && (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
        __JS_FreeValueRT(ctx->rt,JVar7);
      }
      JS_ThrowTypeError(ctx,"proxy: inconsistent prototype");
      return (JSValue)(ZEXT816(6) << 0x40);
    }
  }
  if ((0xfffffff4 < uVar6) && (iVar1 = *JVar3.ptr, *(int *)JVar3.ptr = iVar1 + -1, iVar1 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar7);
  }
LAB_0011c016:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_proxy_getPrototypeOf(JSContext *ctx, JSValueConst obj)
{
    JSProxyData *s;
    JSValue method, ret, proto1;
    int res;

    s = get_proxy_method(ctx, &method, obj, JS_ATOM_getPrototypeOf);
    if (!s)
        return JS_EXCEPTION;
    if (JS_IsUndefined(method))
        return JS_GetPrototype(ctx, s->target);
    ret = JS_CallFree(ctx, method, s->handler, 1, (JSValueConst *)&s->target);
    if (JS_IsException(ret))
        return ret;
    if (JS_VALUE_GET_TAG(ret) != JS_TAG_NULL &&
        JS_VALUE_GET_TAG(ret) != JS_TAG_OBJECT) {
        goto fail;
    }
    res = JS_IsExtensible(ctx, s->target);
    if (res < 0) {
        JS_FreeValue(ctx, ret);
        return JS_EXCEPTION;
    }
    if (!res) {
        /* check invariant */
        proto1 = JS_GetPrototype(ctx, s->target);
        if (JS_IsException(proto1)) {
            JS_FreeValue(ctx, ret);
            return JS_EXCEPTION;
        }
        if (JS_VALUE_GET_OBJ(proto1) != JS_VALUE_GET_OBJ(ret)) {
            JS_FreeValue(ctx, proto1);
        fail:
            JS_FreeValue(ctx, ret);
            return JS_ThrowTypeError(ctx, "proxy: inconsistent prototype");
        }
        JS_FreeValue(ctx, proto1);
    }
    return ret;
}